

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::Kernel::MergePartialFromCodedStream(Kernel *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  int iVar6;
  LinearKernel *this_00;
  PolyKernel *this_01;
  SigmoidKernel *this_02;
  RBFKernel *this_03;
  pair<int,_int> pVar7;
  char cVar8;
  Limit limit;
  ulong uVar9;
  CodedInputStream *this_04;
  
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0024acf1;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0024acf1:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar9 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar5 | uVar9;
    }
    uVar5 = (uint32)uVar9;
    if ((uVar9 & 0x100000000) == 0) goto switchD_0024ad4b_default;
    cVar8 = (char)uVar9;
    switch((uint)(uVar9 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar8 != '\n') break;
      if (this->_oneof_case_[0] != 1) {
        clear_kernel(this);
        this->_oneof_case_[0] = 1;
        this_00 = (LinearKernel *)operator_new(0x18);
        LinearKernel::LinearKernel(this_00);
        (this->kernel_).linearkernel_ = this_00;
      }
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (iVar6 = (int)(char)*puVar3, -1 < iVar6)) {
        input->buffer_ = puVar3 + 1;
      }
      else {
        iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar6 < 0) {
          return false;
        }
      }
      this_04 = input;
      pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar6);
      if ((long)pVar7 < 0) {
        return false;
      }
      bVar4 = LinearKernel::MergePartialFromCodedStream((LinearKernel *)this_04,input);
      if (!bVar4) {
        return false;
      }
      limit = pVar7.first;
LAB_0024afa7:
      bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,limit);
      goto LAB_0024afac;
    case 2:
      if (cVar8 == '\x12') {
        if (this->_oneof_case_[0] == 2) {
          this_03 = (this->kernel_).rbfkernel_;
        }
        else {
          clear_kernel(this);
          this->_oneof_case_[0] = 2;
          this_03 = (RBFKernel *)operator_new(0x20);
          RBFKernel::RBFKernel(this_03);
          (this->kernel_).rbfkernel_ = this_03;
        }
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (iVar6 = (int)(char)*puVar3, -1 < iVar6)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if ((long)pVar7 < 0) {
          return false;
        }
        bVar4 = RBFKernel::MergePartialFromCodedStream(this_03,input);
LAB_0024af9d:
        if (bVar4 == false) {
          return false;
        }
        limit = pVar7.first;
        goto LAB_0024afa7;
      }
      break;
    case 3:
      if (cVar8 == '\x1a') {
        if (this->_oneof_case_[0] == 3) {
          this_01 = (this->kernel_).polykernel_;
        }
        else {
          clear_kernel(this);
          this->_oneof_case_[0] = 3;
          this_01 = (PolyKernel *)operator_new(0x28);
          PolyKernel::PolyKernel(this_01);
          (this->kernel_).polykernel_ = this_01;
        }
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (iVar6 = (int)(char)*puVar3, -1 < iVar6)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if ((long)pVar7 < 0) {
          return false;
        }
        bVar4 = PolyKernel::MergePartialFromCodedStream(this_01,input);
        goto LAB_0024af9d;
      }
      break;
    case 4:
      if (cVar8 == '\"') {
        if (this->_oneof_case_[0] == 4) {
          this_02 = (this->kernel_).sigmoidkernel_;
        }
        else {
          clear_kernel(this);
          this->_oneof_case_[0] = 4;
          this_02 = (SigmoidKernel *)operator_new(0x28);
          SigmoidKernel::SigmoidKernel(this_02);
          (this->kernel_).sigmoidkernel_ = this_02;
        }
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (iVar6 = (int)(char)*puVar3, -1 < iVar6)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if ((long)pVar7 < 0) {
          return false;
        }
        bVar4 = SigmoidKernel::MergePartialFromCodedStream(this_02,input);
        goto LAB_0024af9d;
      }
    }
switchD_0024ad4b_default:
    if (uVar5 == 0) {
      return true;
    }
    if ((uVar5 & 7) == 4) {
      return true;
    }
    bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
LAB_0024afac:
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool Kernel::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Kernel)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.LinearKernel linearKernel = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_linearkernel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.RBFKernel rbfKernel = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_rbfkernel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.PolyKernel polyKernel = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_polykernel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SigmoidKernel sigmoidKernel = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_sigmoidkernel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Kernel)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Kernel)
  return false;
#undef DO_
}